

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void LzFindPrepare(void)

{
  BoolInt BVar1;
  LZFIND_SATUR_SUB_CODE_FUNC local_10;
  LZFIND_SATUR_SUB_CODE_FUNC f;
  
  local_10 = (LZFIND_SATUR_SUB_CODE_FUNC)0x0;
  BVar1 = CPU_IsSupported_SSE41();
  if (BVar1 != 0) {
    local_10 = LzFind_SaturSub_128;
    BVar1 = CPU_IsSupported_AVX2();
    if (BVar1 != 0) {
      local_10 = LzFind_SaturSub_256;
    }
  }
  g_LzFind_SaturSub = local_10;
  return;
}

Assistant:

void LzFindPrepare(void)
{
  #ifndef FORCE_LZFIND_SATUR_SUB_128
  #ifdef USE_LZFIND_SATUR_SUB_128
  LZFIND_SATUR_SUB_CODE_FUNC f = NULL;
  #ifdef MY_CPU_ARM_OR_ARM64
  {
    if (CPU_IsSupported_NEON())
    {
      // #pragma message ("=== LzFind NEON")
      PRF(printf("\n=== LzFind NEON\n"));
      f = LzFind_SaturSub_128;
    }
    // f = 0; // for debug
  }
  #else // MY_CPU_ARM_OR_ARM64
  if (CPU_IsSupported_SSE41())
  {
    // #pragma message ("=== LzFind SSE41")
    PRF(printf("\n=== LzFind SSE41\n"));
    f = LzFind_SaturSub_128;

    #ifdef USE_LZFIND_SATUR_SUB_256
    if (CPU_IsSupported_AVX2())
    {
      // #pragma message ("=== LzFind AVX2")
      PRF(printf("\n=== LzFind AVX2\n"));
      f = LzFind_SaturSub_256;
    }
    #endif
  }
  #endif // MY_CPU_ARM_OR_ARM64
  g_LzFind_SaturSub = f;
  #endif // USE_LZFIND_SATUR_SUB_128
  #endif // FORCE_LZFIND_SATUR_SUB_128
}